

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void vkt::BindingModel::anon_unknown_1::ImageSampleRenderInstance::
     writeImageSamplerDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,ShaderInputInterface shaderInterface,
               bool isImmutable,ImageSampleInstanceImages *images,VkDescriptorSet descriptorSet,
               VkDescriptorSetLayout layout,Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  VkDescriptorUpdateTemplateKHR obj;
  VkDescriptorImageInfo imageSamplers [2];
  VkDescriptorUpdateTemplateEntryKHR *local_118;
  iterator iStack_110;
  VkDescriptorUpdateTemplateEntryKHR *local_108;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  VkDevice local_e8;
  VkAllocationCallbacks *pVStack_e0;
  Move<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorUpdateTemplateCreateInfoKHR local_b0;
  VkDescriptorImageInfo local_68;
  VkDescriptorImageInfo local_50;
  
  local_68.sampler.m_internal = 0;
  local_50.sampler.m_internal = 0;
  if (!isImmutable || withPush) {
    local_68.sampler.m_internal =
         (images->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
    local_50.sampler.m_internal =
         (images->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
  }
  local_68.imageView.m_internal =
       (images->super_ImageInstanceImages).m_imageViewA.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_68.imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  local_50.imageView.m_internal =
       (images->super_ImageInstanceImages).m_imageViewB.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_50.imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  local_108 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_118 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  iStack_110._M_current = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_b0.pNext = (void *)0x0;
  local_b0.flags = 0;
  local_b0.descriptorUpdateEntryCount = 0;
  local_b0.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_b0.templateType = (VkDescriptorUpdateTemplateTypeKHR)withPush;
  local_b0.descriptorSetLayout.m_internal = layout.m_internal;
  local_b0.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_b0.pipelineLayout.m_internal = pipelineLayout.m_internal;
  local_b0.set = 0;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>(updateRegistry,&local_68);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>(updateRegistry,&local_50);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_e8 = (VkDevice)
               *(updateRegistry->m_updateEntryOffsets).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 1;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x0;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
      goto LAB_0054d435;
    }
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_e8 = (VkDevice)
               *(updateRegistry->m_updateEntryOffsets).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 1;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x0;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
    }
    else {
      (iStack_110._M_current)->offset = (deUintptr)local_e8;
      (iStack_110._M_current)->stride = 0;
      (iStack_110._M_current)->dstBinding = 0;
      (iStack_110._M_current)->dstArrayElement = 0;
      (iStack_110._M_current)->descriptorCount = 1;
      (iStack_110._M_current)->descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
      iStack_110._M_current = iStack_110._M_current + 1;
    }
    local_e8 = (VkDevice)
               (updateRegistry->m_updateEntryOffsets).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[1];
    local_f8._0_4_ = 1;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 1;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x0;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
      goto LAB_0054d435;
    }
  }
  else {
    if (shaderInterface != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_0054d435;
    local_e8 = (VkDevice)
               *(updateRegistry->m_updateEntryOffsets).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 2;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x18;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
      goto LAB_0054d435;
    }
  }
  (iStack_110._M_current)->offset = (deUintptr)local_e8;
  (iStack_110._M_current)->stride = (deUintptr)pVStack_e0;
  (iStack_110._M_current)->dstBinding = local_f8._0_4_;
  (iStack_110._M_current)->dstArrayElement = local_f8._4_4_;
  (iStack_110._M_current)->descriptorCount = (deUint32)uStack_f0;
  (iStack_110._M_current)->descriptorType = uStack_f0._4_4_;
  iStack_110._M_current = iStack_110._M_current + 1;
LAB_0054d435:
  local_b0.pDescriptorUpdateEntries = local_118;
  local_b0.descriptorUpdateEntryCount =
       (deUint32)((ulong)((long)iStack_110._M_current - (long)local_118) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_d8,vki,device,&local_b0,(VkAllocationCallbacks *)0x0);
  local_e8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device;
  pVStack_e0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator;
  local_f8 = (undefined1  [8])
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal;
  uStack_f0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&(updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter,obj)
    ;
  }
  (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.m_device =
       local_e8;
  (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.m_allocator =
       pVStack_e0;
  *(undefined4 *)
   &(updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.m_internal =
       local_f8._0_4_;
  *(undefined4 *)
   ((long)&(updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.m_internal
   + 4) = local_f8._4_4_;
  *(deUint32 *)
   &(updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.m_deviceIface =
       (deUint32)uStack_f0;
  *(VkDescriptorType *)
   ((long)&(updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
           m_deviceIface + 4) = uStack_f0._4_4_;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter,
               (VkDescriptorUpdateTemplateKHR)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal);
  }
  if (!withPush) {
    (*vki->_vptr_DeviceInterface[0x92])
              (vki,device,descriptorSet.m_internal,
               (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.
               m_internal,
               (updateRegistry->m_updateEntries).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_118 != (VkDescriptorUpdateTemplateEntryKHR *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  return;
}

Assistant:

void ImageSampleRenderInstance::writeImageSamplerDescriptorSetWithTemplate (const vk::DeviceInterface&						vki,
																			vk::VkDevice									device,
																			ShaderInputInterface							shaderInterface,
																			bool											isImmutable,
																			const ImageSampleInstanceImages&				images,
																			vk::VkDescriptorSet								descriptorSet,
																			vk::VkDescriptorSetLayout						layout,
																			vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
																			RawUpdateRegistry&								updateRegistry,
																			bool											withPush,
																			vk::VkPipelineLayout							pipelineLayout)
{
	const vk::VkSampler					samplers[2]			=
	{
		(isImmutable && !withPush) ? (0) : (images.getSamplerA()),
		(isImmutable && !withPush) ? (0) : (images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo		imageSamplers[2]	=
	{
		vk::makeDescriptorImageInfo(samplers[0], images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		vk::makeDescriptorImageInfo(samplers[1], images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};

	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	updateRegistry.addWriteObject(imageSamplers[0]);
	updateRegistry.addWriteObject(imageSamplers[1]);

	// combined image samplers
	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0, 0, 2, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(0), sizeof(imageSamplers[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	updateTemplate									= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}